

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O0

void __thiscall
FGLInterface::Precache
          (FGLInterface *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  hash_t hVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  void *__s;
  AActor *pAVar12;
  FSpriteModelFrame *smf_00;
  spritedef_t *psVar13;
  FModel **ppFVar14;
  FTexture *pFVar15;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *this_00;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *pTVar16;
  ulong uVar17;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *local_130;
  uint local_fc;
  uint i_8;
  FTexture *tex_2;
  int i_7;
  cycle_t precacheProfiler;
  PrecacheProgress precacheProgress;
  FTexture *tex_1;
  int i_6;
  int cnt;
  uint i_5;
  FTextureID pic;
  spriteframe_t *frame;
  int k;
  int j;
  int i_4;
  int i_3;
  FSpriteModelFrame *smf;
  int local_90;
  int local_8c;
  int i_2;
  int gltrans;
  PClassActor *cls;
  int index;
  int i_1;
  FSkyBox *sb;
  FTexture *tex;
  void *pvStack_60;
  int i;
  BYTE *modellist;
  Pair *pair;
  Iterator it;
  SpriteHits **spritehitlist;
  SpriteHits *spritelist;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist_local;
  BYTE *texhitlist_local;
  FGLInterface *this_local;
  
  uVar5 = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  uVar11 = CONCAT44(0,uVar5);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar11;
  uVar9 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar17 = uVar9 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar9) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar17);
  *puVar10 = uVar11;
  pTVar16 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)(puVar10 + 1);
  if (uVar11 != 0) {
    local_130 = pTVar16;
    do {
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::TMap(local_130);
      local_130 = local_130 + 1;
    } while (local_130 != pTVar16 + uVar11);
  }
  iVar6 = FTextureManager::NumTextures(&TexMan);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar6;
  uVar11 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  it._8_8_ = operator_new__(uVar11);
  TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
  ::TMapIterator((TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                  *)&pair,actorhitlist);
  uVar5 = TArray<FModel_*,_FModel_*>::Size(&Models.super_TArray<FModel_*,_FModel_*>);
  __s = operator_new__((ulong)uVar5);
  pvStack_60 = __s;
  uVar5 = TArray<FModel_*,_FModel_*>::Size(&Models.super_TArray<FModel_*,_FModel_*>);
  memset(__s,0,(ulong)uVar5);
  uVar3 = it._8_8_;
  iVar6 = FTextureManager::NumTextures(&TexMan);
  memset((void *)uVar3,0,(long)iVar6 << 3);
  for (tex._4_4_ = 0; iVar6 = tex._4_4_, iVar7 = FTextureManager::NumTextures(&TexMan),
      iVar6 < iVar7; tex._4_4_ = tex._4_4_ + 1) {
    if (((texhitlist[tex._4_4_] & 5) != 0) &&
       (sb = (FSkyBox *)FTextureManager::ByIndex(&TexMan,tex._4_4_),
       (*(ushort *)&(sb->super_FTexture).gl_info.field_0x4c >> 4 & 1) != 0)) {
      _index = sb;
      for (cls._4_4_ = 0; cls._4_4_ < 6; cls._4_4_ = cls._4_4_ + 1) {
        if (_index->faces[cls._4_4_] != (FTexture *)0x0) {
          cls._0_4_ = FTextureID::GetIndex(&_index->faces[cls._4_4_]->id);
          texhitlist[(int)cls] = texhitlist[(int)cls] | 2;
        }
      }
    }
  }
  while (bVar4 = TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                 ::NextPair((TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                             *)&pair,(Pair **)&modellist), bVar4) {
    _i_2 = *(PClass **)modellist;
    pAVar12 = GetDefaultByType(_i_2);
    local_8c = GLTranslationPalette::GetInternalTranslation(pAVar12->Translation);
    for (local_90 = 0;
        local_90 <
        *(int *)&_i_2[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                 super_DObject.GCNext; local_90 = local_90 + 1) {
      smf._7_1_ = 1;
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::Insert
                (pTVar16 + *(ushort *)
                            (_i_2[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                             super_DObject._vptr_DObject + (long)local_90 * 5U + 2),local_8c,
                 (bool *)((long)&smf + 7));
      smf_00 = gl_FindModelFrame(_i_2,(uint)*(ushort *)
                                             (_i_2[1].super_PStruct.super_PNamedType.
                                              super_PCompoundType.super_PType.super_DObject.
                                              _vptr_DObject + (long)local_90 * 5U + 2),
                                 (uint)*(byte *)((long)_i_2[1].super_PStruct.super_PNamedType.
                                                       super_PCompoundType.super_PType.super_DObject
                                                       ._vptr_DObject + (long)local_90 * 0x28 + 0x16
                                                ),false);
      if (smf_00 != (FSpriteModelFrame *)0x0) {
        for (j = 0; j < 4; j = j + 1) {
          bVar4 = FTextureID::isValid(smf_00->skinIDs + j);
          if (bVar4) {
            iVar6 = FTextureID::GetIndex(smf_00->skinIDs + j);
            texhitlist[iVar6] = texhitlist[iVar6] | 2;
          }
          else if (smf_00->modelIDs[j] != -1) {
            ppFVar14 = TArray<FModel_*,_FModel_*>::operator[]
                                 (&Models.super_TArray<FModel_*,_FModel_*>,(long)smf_00->modelIDs[j]
                                 );
            FModel::PushSpriteMDLFrame(*ppFVar14,smf_00,j);
            ppFVar14 = TArray<FModel_*,_FModel_*>::operator[]
                                 (&Models.super_TArray<FModel_*,_FModel_*>,(long)smf_00->modelIDs[j]
                                 );
            (*(*ppFVar14)->_vptr_FModel[6])(*ppFVar14,texhitlist);
          }
          if (smf_00->modelIDs[j] != -1) {
            *(undefined1 *)((long)pvStack_60 + (long)smf_00->modelIDs[j]) = 1;
          }
        }
      }
    }
  }
  k = TArray<spritedef_t,_spritedef_t>::Size(&sprites);
  while (k = k - 1, -1 < k) {
    hVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar16 + k);
    if (hVar8 != 0) {
      for (frame._4_4_ = 0; psVar13 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)k)
          , frame._4_4_ < (int)(uint)psVar13->numframes; frame._4_4_ = frame._4_4_ + 1) {
        psVar13 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)k);
        _i_5 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                         (&SpriteFrames,(long)(int)((uint)psVar13->spriteframes + frame._4_4_));
        for (frame._0_4_ = 0; (int)frame < 0x10; frame._0_4_ = (int)frame + 1) {
          cnt = _i_5->Texture[(int)frame].texnum;
          bVar4 = FTextureID::isValid((FTextureID *)&cnt);
          uVar3 = it._8_8_;
          if (bVar4) {
            iVar6 = FTextureID::GetIndex((FTextureID *)&cnt);
            *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)(uVar3 + (long)iVar6 * 8) =
                 pTVar16 + k;
          }
        }
      }
    }
  }
  for (i_6 = 0; uVar5 = TArray<FModel_*,_FModel_*>::Size(&Models.super_TArray<FModel_*,_FModel_*>),
      (uint)i_6 < uVar5; i_6 = i_6 + 1) {
    if (*(char *)((long)pvStack_60 + (ulong)(uint)i_6) == '\0') {
      ppFVar14 = TArray<FModel_*,_FModel_*>::operator[]
                           (&Models.super_TArray<FModel_*,_FModel_*>,(ulong)(uint)i_6);
      FModel::DestroyVertexBuffer(*ppFVar14);
    }
  }
  tex_2._4_4_ = FTextureManager::NumTextures(&TexMan);
  tex_1._0_4_ = tex_2._4_4_;
  while (tex_1._0_4_ = (int)tex_1 + -1, -1 < (int)tex_1) {
    pFVar15 = FTextureManager::ByIndex(&TexMan,(int)tex_1);
    if (pFVar15 != (FTexture *)0x0) {
      if ((texhitlist[(int)tex_1] == '\0') && ((pFVar15->gl_info).Material[0] != (FMaterial *)0x0))
      {
        FMaterial::Clean((pFVar15->gl_info).Material[0],true);
      }
      if (((*(long *)(it._8_8_ + (long)(int)tex_1 * 8) == 0) ||
          (hVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed
                             (*(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                               (it._8_8_ + (long)(int)tex_1 * 8)), hVar8 == 0)) &&
         ((pFVar15->gl_info).Material[1] != (FMaterial *)0x0)) {
        FMaterial::Clean((pFVar15->gl_info).Material[1],true);
      }
    }
  }
  bVar4 = FBoolCVar::operator_cast_to_bool(&gl_precache);
  if (bVar4) {
    anon_unknown.dwarf_2177e7::PrecacheProgress::PrecacheProgress
              ((PrecacheProgress *)((long)&precacheProfiler.Sec + 4));
    cycle_t::Reset((cycle_t *)&stack0xffffffffffffff18);
    cycle_t::Clock((cycle_t *)&stack0xffffffffffffff18);
    while (tex_2._4_4_ = tex_2._4_4_ + -1, -1 < tex_2._4_4_) {
      pFVar15 = FTextureManager::ByIndex(&TexMan,tex_2._4_4_);
      if (((pFVar15 != (FTexture *)0x0) &&
          (PrecacheTexture(this,pFVar15,(uint)texhitlist[tex_2._4_4_]),
          *(long *)(it._8_8_ + (long)tex_2._4_4_ * 8) != 0)) &&
         (hVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed
                            (*(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                              (it._8_8_ + (long)tex_2._4_4_ * 8)), hVar8 != 0)) {
        PrecacheSprite(this,pFVar15,*(SpriteHits **)(it._8_8_ + (long)tex_2._4_4_ * 8));
        anon_unknown.dwarf_2177e7::PrecacheProgress::Update
                  ((PrecacheProgress *)((long)&precacheProfiler.Sec + 4));
      }
    }
    for (local_fc = 0;
        uVar5 = TArray<FModel_*,_FModel_*>::Size(&Models.super_TArray<FModel_*,_FModel_*>),
        local_fc < uVar5; local_fc = local_fc + 1) {
      if (*(char *)((long)pvStack_60 + (ulong)local_fc) != '\0') {
        ppFVar14 = TArray<FModel_*,_FModel_*>::operator[]
                             (&Models.super_TArray<FModel_*,_FModel_*>,(ulong)local_fc);
        (*(*ppFVar14)->_vptr_FModel[5])();
        anon_unknown.dwarf_2177e7::PrecacheProgress::Update
                  ((PrecacheProgress *)((long)&precacheProfiler.Sec + 4));
      }
    }
    cycle_t::Unclock((cycle_t *)&stack0xffffffffffffff18);
    cycle_t::TimeMS((cycle_t *)&stack0xffffffffffffff18);
    DPrintf(3,"\x1cGTextures were precached in %.03f ms\n");
  }
  if (it._8_8_ != 0) {
    operator_delete__((void *)it._8_8_);
  }
  if (pTVar16 != (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) {
    uVar11 = *puVar10;
    this_00 = pTVar16 + uVar11;
    while (pTVar16 != this_00) {
      this_00 = this_00 + -1;
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap(this_00);
    }
    operator_delete__(puVar10,uVar11 * 0x18 + 8);
  }
  if (pvStack_60 != (void *)0x0) {
    operator_delete__(pvStack_60);
  }
  return;
}

Assistant:

void FGLInterface::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	SpriteHits *spritelist = new SpriteHits[sprites.Size()];
	SpriteHits **spritehitlist = new SpriteHits*[TexMan.NumTextures()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;
	BYTE *modellist = new BYTE[Models.Size()];
	memset(modellist, 0, Models.Size());
	memset(spritehitlist, 0, sizeof(SpriteHits**) * TexMan.NumTextures());

	// this isn't done by the main code so it needs to be done here first:
	// check skybox textures and mark the separate faces as used
	for (int i = 0; i<TexMan.NumTextures(); i++)
	{
		// HIT_Wall must be checked for MBF-style sky transfers. 
		if (texhitlist[i] & (FTextureManager::HIT_Sky | FTextureManager::HIT_Wall))
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex->gl_info.bSkybox)
			{
				FSkyBox *sb = static_cast<FSkyBox*>(tex);
				for (int i = 0; i<6; i++)
				{
					if (sb->faces[i])
					{
						int index = sb->faces[i]->id.GetIndex();
						texhitlist[index] |= FTextureManager::HIT_Flat;
					}
				}
			}
		}
	}

	// Check all used actors.
	// 1. mark all sprites associated with its states
	// 2. mark all model data and skins associated with its states
	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;
		int gltrans = GLTranslationPalette::GetInternalTranslation(GetDefaultByType(cls)->Translation);

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite].Insert(gltrans, true);
			FSpriteModelFrame * smf = gl_FindModelFrame(cls, cls->OwnedStates[i].sprite, cls->OwnedStates[i].Frame, false);
			if (smf != NULL)
			{
				for (int i = 0; i < MAX_MODELS_PER_FRAME; i++)
				{
					if (smf->skinIDs[i].isValid())
					{
						texhitlist[smf->skinIDs[i].GetIndex()] |= FTexture::TEX_Flat;
					}
					else if (smf->modelIDs[i] != -1)
					{
						Models[smf->modelIDs[i]]->PushSpriteMDLFrame(smf, i);
						Models[smf->modelIDs[i]]->AddSkins(texhitlist);
					}
					if (smf->modelIDs[i] != -1)
					{
						modellist[smf->modelIDs[i]] = 1;
					}
				}
			}
		}
	}

	// mark all sprite textures belonging to the marked sprites.
	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i].CountUsed())
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						spritehitlist[pic.GetIndex()] = &spritelist[i];
					}
				}
			}
		}
	}

	// delete everything unused before creating any new resources to avoid memory usage peaks.

	// delete unused models
	for (unsigned i = 0; i < Models.Size(); i++)
	{
		if (!modellist[i]) Models[i]->DestroyVertexBuffer();
	}

	// delete unused textures
	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		FTexture *tex = TexMan.ByIndex(i);
		if (tex != nullptr)
		{
			if (!texhitlist[i])
			{
				if (tex->gl_info.Material[0]) tex->gl_info.Material[0]->Clean(true);
			}
			if (spritehitlist[i] == nullptr || (*spritehitlist[i]).CountUsed() == 0)
			{
				if (tex->gl_info.Material[1]) tex->gl_info.Material[1]->Clean(true);
			}
		}
	}

	if (gl_precache)
	{
		PrecacheProgress precacheProgress;

		// Consider to comment out PrecacheProgress::Update() call below
		// in order to get more precise timing results
		cycle_t precacheProfiler;
		precacheProfiler.Reset();
		precacheProfiler.Clock();

		// cache all used textures
		for (int i = cnt - 1; i >= 0; i--)
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex != nullptr)
			{
				PrecacheTexture(tex, texhitlist[i]);
				if (spritehitlist[i] != nullptr && (*spritehitlist[i]).CountUsed() > 0)
				{
					PrecacheSprite(tex, *spritehitlist[i]);
					precacheProgress.Update();
				}
			}
		}

		// cache all used models
		for (unsigned i = 0; i < Models.Size(); i++)
		{
			if (modellist[i])
			{
				Models[i]->BuildVertexBuffer();
				precacheProgress.Update();
			}
		}

		precacheProfiler.Unclock();
		DPrintf(DMSG_NOTIFY, TEXTCOLOR_RED "Textures were precached in %.03f ms\n", precacheProfiler.TimeMS());
	}

	delete[] spritehitlist;
	delete[] spritelist;
	delete[] modellist;
}